

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::setContent
          (QWidgetTextControlPrivate *this,TextFormat format,QString *text,QTextDocument *document)

{
  QTextCursor *pQVar1;
  ColorGroup CVar2;
  QWidgetTextControl *this_00;
  QTextDocument *pQVar3;
  QPalettePrivate *pQVar4;
  int iVar5;
  QTextDocument *this_01;
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_a0 [8];
  QObject local_98 [8];
  Object local_90 [8];
  Object local_88 [8];
  Object local_80 [8];
  Object local_78 [8];
  Object local_70 [8];
  Object local_68 [8];
  Object local_60 [8];
  QTextCursor formatCursor;
  ColorGroup CStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  ConnectionType type_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  pQVar1 = &this->cursor;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  pQVar3 = this->doc;
  type = (ConnectionType)this;
  type_00 = (ConnectionType)this_00;
  if (pQVar3 == (QTextDocument *)0x0) {
    this_01 = document;
    if (document == (QTextDocument *)0x0) {
      QApplication::palette((QApplication *)&formatCursor,"QWidgetTextControl");
      CVar2 = (this->palette).currentGroup;
      (this->palette).currentGroup = CStack_50;
      CStack_50 = CVar2;
      pQVar4 = (this->palette).d;
      (this->palette).d = _formatCursor;
      _formatCursor = pQVar4;
      QPalette::~QPalette((QPalette *)&formatCursor);
      this_01 = (QTextDocument *)operator_new(0x10);
      QTextDocument::QTextDocument(this_01,(QObject *)this_00);
    }
    this->doc = this_01;
    _q_documentLayoutChanged(this);
    QTextCursor::QTextCursor(&formatCursor,this->doc);
    pQVar4 = *(QPalettePrivate **)&this->cursor;
    *(QPalettePrivate **)&this->cursor = _formatCursor;
    _formatCursor = pQVar4;
    QTextCursor::~QTextCursor(&formatCursor);
    _formatCursor = (QPalette)ZEXT816(0x47b6e0);
    QObjectPrivate::connect<void(QTextDocument::*)(),void(QWidgetTextControlPrivate::*)()>
              (local_60,(offset_in_QTextDocument_to_subr)this->doc,
               (Object *)QTextDocument::contentsChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    _formatCursor = (QPalette)ZEXT816(0x47b6f8);
    QObjectPrivate::
    connect<void(QTextDocument::*)(QTextCursor_const&),void(QWidgetTextControlPrivate::*)(QTextCursor_const&)>
              (local_68,(offset_in_QTextDocument_to_subr)this->doc,
               (Object *)QTextDocument::cursorPositionChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    _formatCursor = (QPalette)ZEXT816(0x47b5ca);
    QObjectPrivate::connect<void(QTextDocument::*)(),void(QWidgetTextControlPrivate::*)()>
              (local_70,(offset_in_QTextDocument_to_subr)this->doc,
               (Object *)QTextDocument::documentLayoutChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    _CStack_50 = (uint *)0x0;
    _formatCursor = (QPalettePrivate *)QWidgetTextControl::undoAvailable;
    QObject::connect<void(QTextDocument::*)(bool),void(QWidgetTextControl::*)(bool)>
              (local_78,(offset_in_QTextDocument_to_subr)this->doc,
               (ContextType *)QTextDocument::undoAvailable,
               (offset_in_QWidgetTextControl_to_subr *)0x0,type_00);
    QMetaObject::Connection::~Connection((Connection *)local_78);
    _CStack_50 = (uint *)0x0;
    _formatCursor = (QPalettePrivate *)QWidgetTextControl::redoAvailable;
    QObject::connect<void(QTextDocument::*)(bool),void(QWidgetTextControl::*)(bool)>
              (local_80,(offset_in_QTextDocument_to_subr)this->doc,
               (ContextType *)QTextDocument::redoAvailable,
               (offset_in_QWidgetTextControl_to_subr *)0x0,type_00);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    _CStack_50 = (uint *)0x0;
    _formatCursor = (QPalettePrivate *)QWidgetTextControl::modificationChanged;
    QObject::connect<void(QTextDocument::*)(bool),void(QWidgetTextControl::*)(bool)>
              (local_88,(offset_in_QTextDocument_to_subr)this->doc,
               (ContextType *)QTextDocument::modificationChanged,
               (offset_in_QWidgetTextControl_to_subr *)0x0,type_00);
    QMetaObject::Connection::~Connection((Connection *)local_88);
    _CStack_50 = (uint *)0x0;
    _formatCursor = (QPalettePrivate *)QWidgetTextControl::blockCountChanged;
    QObject::connect<void(QTextDocument::*)(int),void(QWidgetTextControl::*)(int)>
              (local_90,(offset_in_QTextDocument_to_subr)this->doc,
               (ContextType *)QTextDocument::blockCountChanged,
               (offset_in_QWidgetTextControl_to_subr *)0x0,type_00);
    QMetaObject::Connection::~Connection((Connection *)local_90);
  }
  QTextDocument::isUndoRedoEnabled();
  if (document == (QTextDocument *)0x0) {
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
  }
  if (setContent(Qt::TextFormat,QString_const&,QTextDocument*)::contentsChangedIndex == '\0') {
    iVar5 = __cxa_guard_acquire(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                                 contentsChangedIndex);
    if (iVar5 != 0) {
      _formatCursor =
           (QPalette)
           QMetaMethod::fromSignal<void(QTextDocument::*)()>
                     ((QMetaMethod *)QTextDocument::contentsChanged,0);
      setContent::contentsChangedIndex = QMetaMethod::methodIndex();
      __cxa_guard_release(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                           contentsChangedIndex);
    }
  }
  if (setContent(Qt::TextFormat,QString_const&,QTextDocument*)::textChangedIndex == '\0') {
    iVar5 = __cxa_guard_acquire(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                                 textChangedIndex);
    if (iVar5 != 0) {
      _formatCursor =
           (QPalette)
           QMetaMethod::fromSignal<void(QWidgetTextControl::*)()>
                     ((QMetaMethod *)QWidgetTextControl::textChanged,0);
      setContent::textChangedIndex = QMetaMethod::methodIndex();
      __cxa_guard_release(&setContent(Qt::TextFormat,QString_const&,QTextDocument*)::
                           textChangedIndex);
    }
  }
  QMetaObject::disconnect
            ((QObject *)this->doc,setContent::contentsChangedIndex,(QObject *)this_00,
             setContent::textChangedIndex);
  if ((text->d).size == 0) {
    if (pQVar3 != (QTextDocument *)0x0) {
      (**(code **)(*(long *)this->doc + 0x60))();
    }
    goto LAB_0047b36c;
  }
  QTextCursor::QTextCursor(&formatCursor);
  pQVar4 = *(QPalettePrivate **)pQVar1;
  *(QPalettePrivate **)pQVar1 = _formatCursor;
  _formatCursor = pQVar4;
  QTextCursor::~QTextCursor(&formatCursor);
  if (format == MarkdownText) {
    QTextDocument::setMarkdown(this->doc,text,0x104f0c);
LAB_0047b332:
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
  }
  else {
    if (format != PlainText) {
      QTextDocument::setHtml((QString *)this->doc);
      goto LAB_0047b332;
    }
    _formatCursor = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&formatCursor,this->doc);
    QTextCursor::beginEditBlock();
    QTextDocument::setPlainText((QString *)this->doc);
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    QTextCursor::select((SelectionType)&formatCursor);
    QTextCursor::setCharFormat((QTextCharFormat *)&formatCursor);
    QTextCursor::endEditBlock();
    QTextCursor::~QTextCursor(&formatCursor);
  }
  QTextCursor::QTextCursor(&formatCursor,this->doc);
  pQVar4 = *(QPalettePrivate **)&this->cursor;
  *(QPalettePrivate **)&this->cursor = _formatCursor;
  _formatCursor = pQVar4;
  QTextCursor::~QTextCursor(&formatCursor);
LAB_0047b36c:
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QMetaObject::connect
            (local_98,(int)this->doc,(QObject *)(ulong)(uint)setContent::contentsChangedIndex,
             type_00,setContent::textChangedIndex,(int *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QWidgetTextControl::textChanged(this_00);
  if (document == (QTextDocument *)0x0) {
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    _q_updateCurrentCharFormatAndSelection(this);
    QTextDocument::setModified(SUB81(this->doc,0));
  }
  else {
    _q_updateCurrentCharFormatAndSelection(this);
  }
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  QWidgetTextControl::cursorPositionChanged(this_00);
  _formatCursor = (QPalette)ZEXT816(0x47b866);
  QObjectPrivate::
  connect<void(QTextDocument::*)(int,int,int),void(QWidgetTextControlPrivate::*)(int,int,int)>
            (local_a0,(offset_in_QTextDocument_to_subr)this->doc,
             (Object *)QTextDocument::contentsChange,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::setContent(Qt::TextFormat format, const QString &text, QTextDocument *document)
{
    Q_Q(QWidgetTextControl);

    // for use when called from setPlainText. we may want to re-use the currently
    // set char format then.
    const QTextCharFormat charFormatForInsertion = cursor.charFormat();

    bool clearDocument = true;
    if (!doc) {
        if (document) {
            doc = document;
        } else {
            palette = QApplication::palette("QWidgetTextControl");
            doc = new QTextDocument(q);
        }
        clearDocument = false;
        _q_documentLayoutChanged();
        cursor = QTextCursor(doc);

// ####        doc->documentLayout()->setPaintDevice(viewport);

        QObjectPrivate::connect(doc, &QTextDocument::contentsChanged, this,
                                &QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection);
        QObjectPrivate::connect(doc, &QTextDocument::cursorPositionChanged, this,
                                &QWidgetTextControlPrivate::_q_emitCursorPosChanged);
        QObjectPrivate::connect(doc, &QTextDocument::documentLayoutChanged, this,
                                &QWidgetTextControlPrivate::_q_documentLayoutChanged);

        // convenience signal forwards
        QObject::connect(doc, &QTextDocument::undoAvailable, q, &QWidgetTextControl::undoAvailable);
        QObject::connect(doc, &QTextDocument::redoAvailable, q, &QWidgetTextControl::redoAvailable);
        QObject::connect(doc, &QTextDocument::modificationChanged, q,
                         &QWidgetTextControl::modificationChanged);
        QObject::connect(doc, &QTextDocument::blockCountChanged, q,
                         &QWidgetTextControl::blockCountChanged);
    }

    bool previousUndoRedoState = doc->isUndoRedoEnabled();
    if (!document)
        doc->setUndoRedoEnabled(false);

    //Saving the index save some time.
    static int contentsChangedIndex = QMetaMethod::fromSignal(&QTextDocument::contentsChanged).methodIndex();
    static int textChangedIndex = QMetaMethod::fromSignal(&QWidgetTextControl::textChanged).methodIndex();
    // avoid multiple textChanged() signals being emitted
    QMetaObject::disconnect(doc, contentsChangedIndex, q, textChangedIndex);

    if (!text.isEmpty()) {
        // clear 'our' cursor for insertion to prevent
        // the emission of the cursorPositionChanged() signal.
        // instead we emit it only once at the end instead of
        // at the end of the document after loading and when
        // positioning the cursor again to the start of the
        // document.
        cursor = QTextCursor();
        if (format == Qt::PlainText) {
            QTextCursor formatCursor(doc);
            // put the setPlainText and the setCharFormat into one edit block,
            // so that the syntax highlight triggers only /once/ for the entire
            // document, not twice.
            formatCursor.beginEditBlock();
            doc->setPlainText(text);
            doc->setUndoRedoEnabled(false);
            formatCursor.select(QTextCursor::Document);
            formatCursor.setCharFormat(charFormatForInsertion);
            formatCursor.endEditBlock();
#if QT_CONFIG(textmarkdownreader)
        } else if (format == Qt::MarkdownText) {
            doc->setMarkdown(text);
            doc->setUndoRedoEnabled(false);
#endif
        } else {
#ifndef QT_NO_TEXTHTMLPARSER
            doc->setHtml(text);
#else
            doc->setPlainText(text);
#endif
            doc->setUndoRedoEnabled(false);
        }
        cursor = QTextCursor(doc);
    } else if (clearDocument) {
        doc->clear();
    }
    cursor.setCharFormat(charFormatForInsertion);

    QMetaObject::connect(doc, contentsChangedIndex, q, textChangedIndex);
    emit q->textChanged();
    if (!document)
        doc->setUndoRedoEnabled(previousUndoRedoState);
    _q_updateCurrentCharFormatAndSelection();
    if (!document)
        doc->setModified(false);

    q->ensureCursorVisible();
    emit q->cursorPositionChanged();

    QObjectPrivate::connect(doc, &QTextDocument::contentsChange, this,
                            &QWidgetTextControlPrivate::_q_contentsChanged, Qt::UniqueConnection);
}